

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::GetPropertyDescriptorTrap
          (CustomExternalWrapperObject *this,PropertyId propertyId,
          PropertyDescriptor *resultDescriptor,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  DynamicObject *aValue;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  int iVar6;
  JavascriptFunction *function;
  Type *pTVar7;
  Var pvVar8;
  undefined4 *puVar9;
  RecyclableObject *ptr;
  RecyclableObject *this_01;
  Type typeId;
  PropertyDescriptor *pPVar10;
  ScriptContext *pSVar11;
  ThreadContext *local_80;
  Var getter;
  CustomExternalWrapperObject *local_70;
  Var local_68;
  Var local_60;
  Var local_58;
  Var local_50;
  Var propertyNameNumericValue;
  PropertyDescriptor *local_40;
  Var local_38;
  Var isPropertyNameNumeric;
  
  pSVar11 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  local_40 = resultDescriptor;
  ThreadContext::ProbeStack(pSVar11->threadContext,0xc00,pSVar11,(PVOID)0x0);
  this_00 = requestContext->threadContext;
  propertyNameNumericValue = requestContext;
  BVar5 = EnsureInitialized(this,requestContext);
  if (BVar5 == 0) {
    return 0;
  }
  pTVar7 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  aValue = (pTVar7[1].propertyCache.ptr)->elements[3].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
    pTVar7 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  }
  pSVar11 = (((pTVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar11);
  pvVar8 = propertyNameNumericValue;
  if (bVar3) {
    return 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar5 = JavascriptOperators::GetOwnAccessors
                      (this,propertyId,&stack0xffffffffffffff80,&local_38,
                       (ScriptContext *)propertyNameNumericValue);
    pPVar10 = local_40;
    if (BVar5 == 0) {
      local_50 = (Var)0x0;
      BVar5 = JavascriptOperators::GetOwnProperty
                        (this,propertyId,&local_50,(ScriptContext *)pvVar8,(PropertyValueInfo *)0x0)
      ;
      pPVar10 = local_40;
      if (BVar5 == 0) {
        return 0;
      }
      if (local_50 != (Var)0x0) {
        PropertyDescriptor::SetValue(local_40,local_50);
      }
      iVar6 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x30])
                        (this,(ulong)(uint)propertyId);
      PropertyDescriptor::SetWritable(pPVar10,iVar6 != 0);
    }
    else {
      if (local_80 == (ThreadContext *)0x0) {
        local_80 = *(ThreadContext **)(*(long *)((long)pvVar8 + 8) + 0x430);
      }
      PropertyDescriptor::SetGetter(local_40,local_80);
      if (local_38 == (Var)0x0) {
        local_38 = *(Var *)(*(long *)((long)pvVar8 + 8) + 0x430);
      }
      PropertyDescriptor::SetSetter(pPVar10,local_38);
    }
    iVar6 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                      (this,(ulong)(uint)propertyId);
    PropertyDescriptor::SetConfigurable(pPVar10,iVar6 != 0);
    iVar6 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x32])
                      (this,(ulong)(uint)propertyId);
    PropertyDescriptor::SetEnumerable(pPVar10,iVar6 != 0);
    return 1;
  }
  pvVar8 = GetName((CustomExternalWrapperObject *)pSVar11,(ScriptContext *)propertyNameNumericValue,
                   propertyId,&local_38,&local_50);
  bVar3 = VarIs<Js::JavascriptString>(pvVar8);
  if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptSymbol>(pvVar8), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x1e1,
                                "(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName))"
                                ,
                                "Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName)"
                               );
    if (!bVar3) goto LAB_00a0ea99;
    *puVar9 = 0;
  }
  local_60 = local_38;
  local_58 = local_50;
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_80 = this_00;
  getter = function;
  local_70 = this;
  local_68 = pvVar8;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar4) {
    ptr = (RecyclableObject *)
          GetPropertyDescriptorTrap::anon_class_48_6_f89e725c::operator()
                    ((anon_class_48_6_f89e725c *)&stack0xffffffffffffff80);
    bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00a0e760:
    if (bVar4 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ptr = (RecyclableObject *)
            GetPropertyDescriptorTrap::anon_class_48_6_f89e725c::operator()
                      ((anon_class_48_6_f89e725c *)&stack0xffffffffffffff80);
      bVar4 = ThreadContext::IsOnStack(ptr);
      goto LAB_00a0e760;
    }
    IVar1 = this_00->implicitCallFlags;
    ptr = (RecyclableObject *)
          GetPropertyDescriptorTrap::anon_class_48_6_f89e725c::operator()
                    ((anon_class_48_6_f89e725c *)&stack0xffffffffffffff80);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  pPVar10 = local_40;
  pvVar8 = propertyNameNumericValue;
  this_00->reentrancySafeOrHandled = bVar3;
  if (ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a0ea99;
    *puVar9 = 0;
  }
  bVar3 = TaggedInt::Is(ptr);
  if (bVar3) {
    typeId = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)ptr >> 0x32 != 0) {
      typeId = TypeIds_Number;
      goto LAB_00a0e8b4;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(ptr);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a0ea99;
      *puVar9 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar5 = RecyclableObject::IsExternal(this_01), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00a0ea99:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
  }
LAB_00a0e8b4:
  bVar3 = StaticType::Is(typeId);
  if (typeId == TypeIds_Undefined || !bVar3) {
    BVar5 = JavascriptOperators::ToPropertyDescriptor(ptr,pPVar10,(ScriptContext *)pvVar8);
    JavascriptOperators::CompletePropertyDescriptor
              (pPVar10,(PropertyDescriptor *)0x0,(ScriptContext *)pvVar8);
    return BVar5;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)pvVar8,-0x7ff5ec71,L"getOwnPropertyDescriptor");
}

Assistant:

BOOL CustomExternalWrapperObject::GetPropertyDescriptorTrap(Js::PropertyId propertyId, Js::PropertyDescriptor* resultDescriptor, Js::ScriptContext* requestContext)
{
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = requestContext->GetThreadContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    Js::RecyclableObject * targetObj = this;

    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* gOPDMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap != nullptr)
    {
        gOPDMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap);
    }

    if (GetScriptContext()->IsHeapEnumInProgress())
    {
        return FALSE;
    }

    if (nullptr == gOPDMethod)
    {
        Var getter, setter;
        if (false == JavascriptOperators::GetOwnAccessors(this, propertyId, &getter, &setter, requestContext))
        {
            Var value = nullptr;
            if (false == JavascriptOperators::GetOwnProperty(this, propertyId, &value, requestContext, nullptr))
            {
                return FALSE;
            }
            if (nullptr != value)
            {
                resultDescriptor->SetValue(value);
            }

            resultDescriptor->SetWritable(FALSE != this->IsWritable(propertyId));
        }
        else
        {
            if (nullptr == getter)
            {
                getter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetGetter(getter);

            if (nullptr == setter)
            {
                setter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetSetter(setter);
        }

        resultDescriptor->SetConfigurable(FALSE != this->IsConfigurable(propertyId));
        resultDescriptor->SetEnumerable(FALSE != this->IsEnumerable(propertyId));
        return TRUE;
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Assert(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName));

    Js::Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, gOPDMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    Js::TypeId getResultTypeId = Js::JavascriptOperators::GetTypeId(getResult);
    if (Js::StaticType::Is(getResultTypeId) && getResultTypeId != Js::TypeIds_Undefined)
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
    }

    BOOL toProperty = Js::JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
    Js::JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
    return toProperty;
}